

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_run_container_intersection
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  if (((src_2->n_runs == 1) && (src_2->runs->value == 0)) && (src_2->runs->length == 0xffff)) {
    if (dst != src_1) {
      array_container_copy(src_1,dst);
      return;
    }
  }
  else {
    if (dst->capacity < src_1->cardinality) {
      array_container_grow(dst,src_1->cardinality,false);
    }
    iVar2 = src_2->n_runs;
    if (iVar2 != 0) {
      prVar4 = src_2->runs;
      uVar7 = (uint)prVar4->value;
      uVar11 = (uint)prVar4->length;
      iVar13 = 0;
      iVar10 = 0;
      lVar12 = 0;
      do {
        iVar3 = src_1->cardinality;
        if (iVar3 <= iVar13) {
          dst->cardinality = iVar10;
          return;
        }
        puVar5 = src_1->array;
        uVar1 = puVar5[iVar13];
        bVar15 = uVar11 + uVar7 < (uint)uVar1;
        if (bVar15) {
          lVar12 = (long)(int)lVar12;
          do {
            lVar12 = lVar12 + 1;
            if (iVar2 == (int)lVar12) {
              dst->cardinality = iVar10;
              iVar9 = iVar13;
              goto LAB_00113dc7;
            }
            uVar7 = (uint)prVar4[lVar12].value;
            uVar11 = (uint)prVar4[lVar12].length;
            bVar15 = uVar7 + uVar11 < (uint)uVar1;
          } while (bVar15);
        }
        uVar6 = (ushort)uVar7;
        if (uVar1 < uVar6) {
          iVar14 = iVar13 + 1;
          iVar9 = iVar14;
          if ((iVar14 < iVar3) && (puVar5[iVar14] < uVar6)) {
            iVar13 = iVar13 + 2;
            iVar8 = 1;
            if (iVar13 < iVar3) {
              iVar9 = 1;
              do {
                iVar8 = iVar9;
                if (uVar6 <= puVar5[iVar13]) goto LAB_00113d9c;
                iVar8 = iVar9 * 2;
                iVar13 = iVar14 + iVar9 * 2;
                iVar9 = iVar8;
              } while (iVar13 < iVar3);
            }
            iVar13 = iVar3 + -1;
LAB_00113d9c:
            iVar9 = iVar13;
            if (((puVar5[iVar13] != uVar6) && (iVar9 = iVar3, uVar6 <= puVar5[iVar13])) &&
               (iVar9 = iVar13, iVar14 + (iVar8 >> 1) + 1 != iVar13)) {
              iVar14 = (iVar8 >> 1) + iVar14;
              do {
                iVar9 = iVar13 + iVar14 >> 1;
                if (puVar5[iVar9] == uVar6) break;
                if (uVar6 <= puVar5[iVar9]) {
                  iVar13 = iVar9;
                  iVar9 = iVar14;
                }
                iVar14 = iVar9;
                iVar9 = iVar13;
              } while (iVar14 + 1 != iVar13);
            }
          }
        }
        else {
          dst->array[iVar10] = uVar1;
          iVar10 = iVar10 + 1;
          iVar9 = iVar13 + 1;
        }
LAB_00113dc7:
        iVar13 = iVar9;
      } while (!bVar15);
    }
  }
  return;
}

Assistant:

void array_run_container_intersection(const array_container_t *src_1,
                                      const run_container_t *src_2,
                                      array_container_t *dst) {
    if (run_container_is_full(src_2)) {
        if (dst != src_1) array_container_copy(src_1, dst);
        return;
    }
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    if (src_2->n_runs == 0) {
        return;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                dst->cardinality = newcard;
                return;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            dst->array[newcard] = arrayval;
            newcard++;
            arraypos++;
        }
    }
    dst->cardinality = newcard;
}